

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesnetworkpython.cpp
# Opt level: O0

void __thiscall
PythonModuleClient::recv_event(PythonModuleClient *this,string *origin,string *event,TrodesMsg *msg)

{
  bool_type bVar1;
  TrodesMsg *in_RCX;
  string *in_RDX;
  object_operators<boost::python::api::object> *in_RSI;
  AbstractModuleClient *in_RDI;
  error_already_set *anon_var_0;
  override recv_event;
  PyLockGIL lock;
  string local_98 [8];
  char *in_stack_ffffffffffffff70;
  undefined8 in_stack_ffffffffffffff78;
  string local_78;
  uint local_54;
  TrodesMsg *in_stack_ffffffffffffffb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  override *in_stack_ffffffffffffffc8;
  
  PyLockGIL::PyLockGIL((PyLockGIL *)in_RSI);
  boost::python::wrapper<AbstractModuleClient>::get_override
            ((wrapper<AbstractModuleClient> *)in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  bVar1 = boost::python::api::object_operators::operator_cast_to_function_pointer(in_RSI);
  if (bVar1 != 0) {
    boost::python::override::operator()
              (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8,
               in_stack_ffffffffffffffb0);
    boost::python::detail::method_result::~method_result((method_result *)0x3e680e);
  }
  local_54 = (uint)(bVar1 != 0);
  boost::python::override::~override((override *)0x3e68d4);
  if (local_54 == 0) {
    std::__cxx11::string::string((string *)&local_78,(string *)in_RSI);
    std::__cxx11::string::string(local_98,in_RDX);
    AbstractModuleClient::recv_event(in_RDI,&local_78,(string *)local_98,in_RCX);
    std::__cxx11::string::~string(local_98);
    std::__cxx11::string::~string((string *)&local_78);
    local_54 = 0;
  }
  PyLockGIL::~PyLockGIL((PyLockGIL *)0x3e6945);
  return;
}

Assistant:

void recv_event(std::string origin, std::string event, TrodesMsg &msg){
        PyLockGIL lock;
        if(override recv_event = this->get_override("recv_event")){
            try{
                recv_event(origin, event, msg);
            }
            catch (const error_already_set&){
                std::cout << "Exception in recv_event in application";
                PyErr_Print();
            }
            return;
        }
        AbstractModuleClient::recv_event(origin, event, msg);
    }